

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O3

void Imath_3_2::maxEigenVector<Imath_3_2::Matrix33<double>,Imath_3_2::Vec3<double>>
               (Matrix33<double> *A,Vec3<double> *V)

{
  uint i;
  long lVar1;
  double *pdVar2;
  int iVar3;
  int iVar4;
  Vec3<double> S;
  Matrix33<double> MV;
  Vec3<double> local_70;
  Matrix33<double> local_58;
  
  local_58.x[0][0] = 1.0;
  local_58.x[0][1] = 0.0;
  local_58.x[0][2] = 0.0;
  local_58.x[1][0] = 0.0;
  local_58.x[1][1] = 1.0;
  local_58.x[1][2] = 0.0;
  local_58.x[2][0] = 0.0;
  local_58.x[2][1] = 0.0;
  local_58.x[2][2] = 1.0;
  jacobiEigenSolver<double>(A,&local_70,&local_58,2.220446049250313e-16);
  lVar1 = 1;
  iVar4 = 0;
  do {
    iVar3 = (int)lVar1;
    if (ABS((&local_70.x)[lVar1]) <= ABS((&local_70.x)[iVar4])) {
      iVar3 = iVar4;
    }
    lVar1 = lVar1 + 1;
    iVar4 = iVar3;
  } while (lVar1 != 3);
  pdVar2 = local_58.x[0] + iVar3;
  lVar1 = 0;
  do {
    (&V->x)[lVar1] = *pdVar2;
    lVar1 = lVar1 + 1;
    pdVar2 = pdVar2 + 3;
  } while (lVar1 != 3);
  return;
}

Assistant:

void
maxEigenVector (TM& A, TV& V)
{
    TV S;
    TM MV;
    jacobiEigenSolver (A, S, MV);

    int maxIdx (0);
    for (unsigned int i = 1; i < TV::dimensions (); ++i)
    {
        if (std::abs (S[i]) > std::abs (S[maxIdx])) maxIdx = i;
    }

    for (unsigned int i = 0; i < TV::dimensions (); ++i)
        V[i] = MV[i][maxIdx];
}